

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::upPartialsByPartitionAsync
          (BeagleCPUImpl<double,_1,_1> *this,int *operations,int count)

{
  int **ppiVar1;
  int *piVar2;
  threadData *ptVar3;
  long lVar4;
  packaged_task<void_()> *__stat_loc;
  int *piVar5;
  int j;
  long lVar6;
  int i;
  ulong uVar7;
  long lVar8;
  unique_lock<std::mutex> l;
  packaged_task<void_()> threadTask;
  __shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2> local_98;
  long local_88;
  long local_80;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  _Tuple_impl<4UL,_BeagleOpCodes> local_68;
  _Head_base<3UL,_int,_false> local_64;
  _Head_base<2UL,_const_int_*,_false> local_60;
  _Head_base<1UL,_bool,_false> local_58;
  _Head_base<0UL,_beagle::cpu::BeagleCPUImpl<double,_1,_1>_*,_false> local_50;
  packaged_task<void_()> local_40;
  
  memset(this->gThreadOpCounts,0,(long)this->kNumThreads << 2);
  ppiVar1 = this->gThreadOperations;
  __stat_loc = (packaged_task<void_()> *)this->gThreadOpCounts;
  piVar5 = operations;
  for (uVar7 = 0; uVar7 != (uint)(~(count >> 0x1f) & count); uVar7 = uVar7 + 1) {
    lVar4 = (long)(operations[uVar7 * 9 + 7] % this->kNumThreads);
    piVar2 = ppiVar1[lVar4];
    for (lVar6 = 0; lVar6 != 9; lVar6 = lVar6 + 1) {
      piVar2[(long)*(int *)((long)&(__stat_loc->_M_state).
                                   super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar4 * 4) * 9 + lVar6] = piVar5[lVar6];
    }
    piVar2 = (int *)((long)&(__stat_loc->_M_state).
                            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar4 * 4);
    *piVar2 = *piVar2 + 1;
    piVar5 = piVar5 + 9;
  }
  lVar6 = 0x88;
  lVar8 = 0;
  lVar4 = 0;
  while( true ) {
    uVar7 = (ulong)this->kNumThreads;
    if ((long)uVar7 <= lVar4) break;
    local_60._M_head_impl = this->gThreadOperations[lVar4];
    local_78 = (undefined1  [8])0x1a1;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68.super__Head_base<4UL,_BeagleOpCodes,_false>._M_head_impl =
         (_Head_base<4UL,_BeagleOpCodes,_false>)BEAGLE_OP_NONE;
    local_64._M_head_impl = this->gThreadOpCounts[lVar4];
    local_58._M_head_impl = true;
    local_50._M_head_impl = this;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<int(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,bool,int_const*,int,BeagleOpCodes))(bool,int_const*,int,int)>,void>
              ((packaged_task<void()> *)&local_40,
               (_Bind<int_(beagle::cpu::BeagleCPUImpl<double,_1,_1>::*(beagle::cpu::BeagleCPUImpl<double,_1,_1>_*,_bool,_const_int_*,_int,_BeagleOpCodes))(bool,_const_int_*,_int,_int)>
                *)local_78);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_98);
    local_78 = (undefined1  [8])local_98._M_ptr;
    _Stack_70._M_pi = local_98._M_refcount._M_pi;
    local_98 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                )(ZEXT816(0) << 0x20);
    local_88 = lVar4;
    local_80 = lVar8;
    std::shared_future<void>::operator=
              ((shared_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar8),(shared_future<void> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    ptVar3 = this->gThreads;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_78,
               (mutex_type *)((long)&(ptVar3->t)._M_id._M_thread + lVar6));
    __stat_loc = &local_40;
    std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
    emplace_back<std::packaged_task<void()>>
              ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
               ((long)ptVar3 + lVar6 + -0x80),&local_40);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_78);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
    std::packaged_task<void_()>::~packaged_task(&local_40);
    lVar6 = lVar6 + 0xb8;
    lVar4 = local_88 + 1;
    lVar8 = local_80 + 0x10;
  }
  lVar4 = 0;
  for (lVar6 = 0; lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar4),__stat_loc);
    uVar7 = (ulong)(uint)this->kNumThreads;
    lVar4 = lVar4 + 0x10;
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartialsByPartitionAsync(const int* operations,
                                                                  int count) {

    int numOps = BEAGLE_PARTITION_OP_COUNT;

    memset(gThreadOpCounts, 0, sizeof(int) * kNumThreads);

    for (int i=0; i<count; i++) {
        int t = operations[i * numOps + 7] % kNumThreads;
        for (int j=0; j<numOps; j++) {
            gThreadOperations[t][gThreadOpCounts[t]*numOps + j] = operations[i*numOps + j];
        }
        gThreadOpCounts[t]++;
    }

    for (int i=0; i<kNumThreads; i++) {
        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartials, this,
                      true,
                      (const int*) gThreadOperations[i],
                      gThreadOpCounts[i],
                      BEAGLE_OP_NONE));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

    return BEAGLE_SUCCESS;
}